

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

uint ** matrix_copy(uint **a,uint rows,uint cols)

{
  uint **ppuVar1;
  ulong uVar2;
  ulong uVar3;
  
  ppuVar1 = matrix_new(rows,cols);
  for (uVar2 = 0; uVar2 != rows; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; cols != uVar3; uVar3 = uVar3 + 1) {
      ppuVar1[uVar2][uVar3] = a[uVar2][uVar3];
    }
  }
  return ppuVar1;
}

Assistant:

uint32_t **matrix_copy(uint32_t **a, uint32_t rows, uint32_t cols)
{
    uint32_t **b = matrix_new(rows, cols);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < cols; j++)
            b[i][j] = a[i][j];
    return b;
}